

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

bool __thiscall CFG::containsNode(CFG *this,CfgNode *node)

{
  size_type sVar1;
  bool local_21;
  CfgNode *local_18;
  CfgNode *node_local;
  CFG *this_local;
  
  if (node == (CfgNode *)0x0) {
    local_21 = false;
  }
  else {
    local_18 = node;
    node_local = (CfgNode *)this;
    sVar1 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::count
                      (&this->m_nodes,&local_18);
    local_21 = sVar1 == 1;
  }
  return local_21;
}

Assistant:

bool CFG::containsNode(CfgNode* node) const {
	return node ? (m_nodes.count(node) == 1) : false;
}